

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_tdes_default_hw.c
# Opt level: O0

int ossl_cipher_hw_tdes_cfb(PROV_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  ulong in_RCX;
  uchar *in_RDX;
  uchar *in_RSI;
  long in_RDI;
  int num;
  PROV_TDES_CTX *tctx;
  int local_2c;
  long local_28;
  ulong local_20;
  uchar *local_18;
  uchar *local_10;
  long local_8;
  
  local_2c = *(int *)(in_RDI + 0x70);
  local_28 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_20 = in_RCX; 0x3fffffffffffffff < local_20; local_20 = local_20 + 0xc000000000000000) {
    DES_ede3_cfb64_encrypt
              (local_18,local_10,0x4000000000000000,(DES_key_schedule *)(local_28 + 0xc0),
               (DES_key_schedule *)(local_28 + 0x140),(DES_key_schedule *)(local_28 + 0x1c0),
               (DES_cblock *)(local_8 + 0x94),&local_2c,(uint)(*(byte *)(local_8 + 0x3c) >> 1 & 1));
    local_18 = local_18 + 0x4000000000000000;
    local_10 = local_10 + 0x4000000000000000;
  }
  if (local_20 != 0) {
    DES_ede3_cfb64_encrypt
              (local_18,local_10,local_20,(DES_key_schedule *)(local_28 + 0xc0),
               (DES_key_schedule *)(local_28 + 0x140),(DES_key_schedule *)(local_28 + 0x1c0),
               (DES_cblock *)(local_8 + 0x94),&local_2c,(uint)(*(byte *)(local_8 + 0x3c) >> 1 & 1));
  }
  *(int *)(local_8 + 0x70) = local_2c;
  return 1;
}

Assistant:

static int ossl_cipher_hw_tdes_cfb(PROV_CIPHER_CTX *ctx, unsigned char *out,
                                   const unsigned char *in, size_t inl)
{
    PROV_TDES_CTX *tctx = (PROV_TDES_CTX *)ctx;
    int num = ctx->num;

    while (inl >= MAXCHUNK) {

        DES_ede3_cfb64_encrypt(in, out, (long)MAXCHUNK,
                               &tctx->ks1, &tctx->ks2, &tctx->ks3,
                               (DES_cblock *)ctx->iv, &num, ctx->enc);
        inl -= MAXCHUNK;
        in += MAXCHUNK;
        out += MAXCHUNK;
    }
    if (inl > 0) {
        DES_ede3_cfb64_encrypt(in, out, (long)inl,
                               &tctx->ks1, &tctx->ks2, &tctx->ks3,
                               (DES_cblock *)ctx->iv, &num, ctx->enc);
    }
    ctx->num = num;
    return 1;
}